

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int firLowpassFilter(StkFrames *src,StkFrames *dst,double stopband,double initial_value)

{
  StkFloat *pSVar1;
  int i_1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int i;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Convolution conv;
  double input [16384];
  double coeff [16384];
  Convolution CStack_40078;
  double adStack_40038 [16384];
  double adStack_20038 [16385];
  
  lVar9 = 0;
  do {
    dVar11 = (double)((int)lVar9 + -0x2000);
    dVar12 = cos((dVar11 * 0.0001220703125 + 1.0) * 3.141592653589793);
    dVar11 = dVar11 * stopband;
    dVar13 = 1.0;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      dVar13 = sin(dVar11 * 3.141592653589793);
      dVar13 = dVar13 / (dVar11 * 3.141592653589793);
    }
    adStack_20038[lVar9] = (dVar12 * -0.46 + 0.54) * dVar13 * stopband;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x4000);
  Convolution::Convolution(&CStack_40078,0x4000,adStack_20038);
  lVar9 = 0;
  do {
    adStack_40038[lVar9] = initial_value;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x4000);
  Convolution::convolve(&CStack_40078,adStack_40038,0x4000);
  iVar4 = (int)src->size_;
  if (-0x2000 < iVar4) {
    uVar7 = 0;
    uVar10 = 0xffffe000;
    do {
      uVar3 = iVar4 - uVar7;
      uVar8 = 0x4000;
      if ((int)uVar3 < 0x4000) {
        uVar8 = uVar3;
      }
      uVar6 = 0;
      if (0 < (int)uVar8) {
        uVar6 = (ulong)uVar8;
      }
      if (0 < (int)uVar3) {
        uVar2 = 1;
        if (1 < (int)uVar8) {
          uVar2 = (ulong)uVar8;
        }
        pSVar1 = src->data_;
        uVar5 = 0;
        do {
          adStack_40038[uVar5] = pSVar1[uVar7 + uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      if ((int)uVar3 < 0x4000) {
        if ((int)uVar8 < 0x4000) {
          uVar8 = 0x3fff;
        }
        memset(adStack_40038 + uVar6,0,(ulong)(uVar8 - (int)uVar6) * 8 + 8);
      }
      Convolution::convolve(&CStack_40078,adStack_40038,0x4000);
      pSVar1 = dst->data_;
      lVar9 = 0;
      do {
        iVar4 = (int)(uVar10 + lVar9);
        if ((-1 < iVar4) && (iVar4 < (int)src->size_)) {
          pSVar1[uVar10 + lVar9 & 0xffffffff] = adStack_40038[lVar9];
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x4000);
      uVar7 = uVar7 + (int)uVar6;
      iVar4 = (int)src->size_;
      uVar8 = (int)uVar10 + 0x4000;
      uVar10 = (ulong)uVar8;
    } while ((int)uVar8 < iVar4);
  }
  Convolution::~Convolution(&CStack_40078);
  return iVar4;
}

Assistant:

int firLowpassFilter(const stk::StkFrames &src,
					 stk::StkFrames &dst,
					 double stopband,
					 double initial_value)
{
	int		half_window_len = filter_window_len / 2;
	double	coeff[filter_window_len];
	double	input[filter_window_len];
	
	// フィルタ作成
	for (int i=0; i<filter_window_len; ++i) {
		double	x = i - half_window_len;
		double	window_x = x/half_window_len + 1.0;
		double	window = 0.54 - 0.46 * std::cos(M_PI * window_x);
		coeff[i] = sinc(x * stopband) * window * stopband;
	}
	
	Convolution conv(filter_window_len, coeff);

	// initial_valueの反映
	for (int i=0; i<filter_window_len; ++i) {
		input[i] = initial_value;
	}
	conv.convolve(input, filter_window_len);
	
	int src_index = 0;
	int dst_index = -half_window_len;
	
	while (dst_index < static_cast<int>(src.size())) {
		int input_len = static_cast<int>(src.size()) - src_index;
		if (input_len > filter_window_len) {
			input_len = filter_window_len;
		}
		if (input_len < 0) {
			input_len = 0;
		}
		for (int i=0; i<input_len; ++i) {
			input[i] = src[src_index + i];
		}
		for (int i=input_len; i<filter_window_len; ++i) {
			input[i] = 0;
		}
		conv.convolve(input, filter_window_len);
		src_index += input_len;
		
		for (int i=0; i<filter_window_len; ++i) {
			if ((dst_index >= 0) && (dst_index < static_cast<int>(src.size()))) {
				dst[dst_index] = input[i];
			}
			dst_index++;
		}
	}

	return (int)src.size();
}